

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall CLI::Formatter::make_subcommand_abi_cxx11_(Formatter *this,App *sub)

{
  bool bVar1;
  App *in_RDX;
  FormatterBase *in_RSI;
  string *in_RDI;
  stringstream out;
  App *in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  char *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  undefined2 in_stack_fffffffffffffda8;
  byte bVar2;
  allocator<char> in_stack_fffffffffffffdab;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  allocator<char> in_stack_fffffffffffffdaf;
  string *in_stack_fffffffffffffdb0;
  string *in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffde7;
  App *in_stack_fffffffffffffde8;
  stringstream local_1a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190 [11];
  App *local_18;
  
  local_18 = in_RDX;
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  __rhs = local_190;
  App::get_display_name_abi_cxx11_(in_stack_fffffffffffffde8,(bool)in_stack_fffffffffffffde7);
  bVar5 = 0;
  bVar4 = 0;
  bVar3 = 0;
  bVar2 = 0;
  bVar1 = App::get_required(local_18);
  if (bVar1) {
    __lhs = &stack0xfffffffffffffdaf;
    ::std::allocator<char>::allocator();
    bVar5 = 1;
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88,(allocator<char> *)__rhs)
    ;
    bVar4 = 1;
    FormatterBase::get_label(in_RSI,in_RDI);
    bVar3 = 1;
    ::std::operator+(__lhs,in_stack_fffffffffffffd50);
  }
  else {
    in_stack_fffffffffffffd50 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &stack0xfffffffffffffdab;
    ::std::allocator<char>::allocator();
    bVar2 = 1;
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88,(allocator<char> *)__rhs)
    ;
  }
  ::std::operator+(in_stack_fffffffffffffd88,__rhs);
  App::get_description_abi_cxx11_(in_stack_fffffffffffffd48);
  CLI::detail::format_help
            ((ostream *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             in_stack_fffffffffffffdb0,
             CONCAT17(in_stack_fffffffffffffdaf,
                      CONCAT16(bVar5,CONCAT15(bVar4,CONCAT14(bVar3,CONCAT13(
                                                  in_stack_fffffffffffffdab,
                                                  CONCAT12(bVar2,in_stack_fffffffffffffda8)))))));
  ::std::__cxx11::string::~string(in_stack_fffffffffffffd50);
  ::std::__cxx11::string::~string(in_stack_fffffffffffffd50);
  ::std::__cxx11::string::~string(in_stack_fffffffffffffd50);
  if ((bVar2 & 1) != 0) {
    ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdab);
  }
  if ((bVar3 & 1) != 0) {
    ::std::__cxx11::string::~string(in_stack_fffffffffffffd50);
  }
  if ((bVar4 & 1) != 0) {
    ::std::__cxx11::string::~string(in_stack_fffffffffffffd50);
  }
  if ((bVar5 & 1) != 0) {
    ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdaf);
  }
  ::std::__cxx11::string::~string(in_stack_fffffffffffffd50);
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string Formatter::make_subcommand(const App *sub) const {
    std::stringstream out;
    detail::format_help(out,
                        sub->get_display_name(true) + (sub->get_required() ? " " + get_label("REQUIRED") : ""),
                        sub->get_description(),
                        column_width_);
    return out.str();
}